

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  QList<unsigned_int> *pQVar1;
  FetchAndConvertPixelsFunc p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int offset_00;
  uchar *puVar7;
  uchar *puVar8;
  int *piVar9;
  uint *puVar10;
  uint *b_00;
  int *in_RCX;
  QTextureData *in_RDX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  uint b_1;
  uint t;
  int i;
  int leading;
  int len;
  int end_1;
  int start;
  int count;
  uint *ptr2;
  uint *ptr1;
  uint *buf2;
  uint *buf1;
  int offset;
  int adjust;
  int length;
  int idisty;
  int disty;
  uchar *s2;
  uchar *s1;
  FetchAndConvertPixelsFunc fetch;
  QList<unsigned_int> *clut;
  QPixelLayout *layout;
  int x;
  int y2;
  int y1;
  IntermediateBuffer intermediate;
  int local_40ec;
  int local_40e8;
  uint in_stack_ffffffffffffbf20;
  uint in_stack_ffffffffffffbf24;
  int local_40d8;
  int iVar11;
  int local_4034 [3];
  int local_4028;
  int local_4024;
  int local_4020;
  int local_401c;
  uint local_4018 [2050];
  uint auStack_2010 [2050];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDX->colorTable;
  p_Var2 = qPixelLayouts[in_RDX->format].fetchToARGB32PM;
  local_4020 = (int)*in_R8 >> 0x10;
  local_4024 = -0x55555556;
  local_401c = in_R9D;
  fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
            (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,&local_4020,&local_4024);
  puVar7 = QTextureData::scanLine(in_RDX,local_4020);
  puVar8 = QTextureData::scanLine(in_RDX,local_4024);
  iVar3 = (int)(*in_R8 & 0xffff) >> 8;
  iVar4 = (int)(in_RSI - in_RDI >> 2);
  if (local_401c < 0) {
    local_40ec = local_401c * iVar4;
  }
  else {
    local_40ec = 0;
  }
  local_4028 = *in_RCX + local_40ec >> 0x10;
  iVar5 = qAbs<int>(&local_401c);
  iVar6 = (int)(((long)iVar4 * (long)iVar5 + 0xffff) / 0x10000) + 2;
  piVar9 = qMax<int>(&local_4028,&in_RDX->x1);
  iVar4 = *piVar9;
  local_4034[2] = local_4028 + iVar6;
  piVar9 = qMin<int>(local_4034 + 2,&in_RDX->x2);
  iVar5 = *piVar9;
  local_4034[1] = 1;
  local_4034[0] = iVar5 - iVar4;
  piVar9 = qMax<int>(local_4034 + 1,local_4034);
  iVar11 = *piVar9;
  offset_00 = iVar4 - local_4028;
  puVar10 = (*p_Var2)(local_4018 + offset_00,puVar7,iVar4,iVar11,pQVar1,(QDitherInfo *)0x0);
  b_00 = (*p_Var2)(auStack_2010 + offset_00,puVar8,iVar4,iVar11,pQVar1,(QDitherInfo *)0x0);
  for (local_40d8 = 0; local_40d8 < iVar11; local_40d8 = local_40d8 + 1) {
    in_stack_ffffffffffffbf24 = puVar10[local_40d8];
    in_stack_ffffffffffffbf20 = b_00[local_40d8];
    local_4018[local_40d8 + offset_00] =
         (in_stack_ffffffffffffbf24 & 0xff00ff) * (0x100 - iVar3) +
         (in_stack_ffffffffffffbf20 & 0xff00ff) * iVar3 >> 8 & 0xff00ff;
    auStack_2010[local_40d8 + offset_00] =
         (in_stack_ffffffffffffbf24 >> 8 & 0xff00ff) * (0x100 - iVar3) +
         (in_stack_ffffffffffffbf20 >> 8 & 0xff00ff) * iVar3 >> 8 & 0xff00ff;
  }
  for (iVar3 = 0; iVar3 < offset_00; iVar3 = iVar3 + 1) {
    local_4018[iVar3] = local_4018[offset_00];
    auStack_2010[iVar3] = auStack_2010[offset_00];
  }
  for (local_40e8 = offset_00 + iVar11; local_40e8 < iVar6; local_40e8 = local_40e8 + 1) {
    local_4018[local_40e8] = local_4018[local_40e8 + -1];
    auStack_2010[local_40e8] = auStack_2010[local_40e8 + -1];
  }
  intermediate_adder(b_00,(uint *)CONCAT44(iVar6,iVar4),(IntermediateBuffer *)CONCAT44(iVar5,iVar11)
                     ,offset_00,(int *)CONCAT44(in_stack_ffffffffffffbf24,in_stack_ffffffffffffbf20)
                     ,iVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                     int &fx, int &fy, int fdx, int /*fdy*/)
{
    const QPixelLayout *layout = &qPixelLayouts[image.format];
    const QList<QRgb> *clut = image.colorTable;
    const FetchAndConvertPixelsFunc fetch = layout->fetchToARGB32PM;

    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uchar *s1 = image.scanLine(y1);
    const uchar *s2 = image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    uint *buf1 = intermediate.buffer_rb;
    uint *buf2 = intermediate.buffer_ag;
    const uint *ptr1;
    const uint *ptr2;

    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    Q_ASSERT(count <= BufferSize + 2);

    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0)
            x += image.width;
        int len1 = qMin(count, image.width - x);
        int len2 = qMin(x, count - len1);

        ptr1 = fetch(buf1, s1, x, len1, clut, nullptr);
        ptr2 = fetch(buf2, s2, x, len1, clut, nullptr);
        for (int i = 0; i < len1; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        if (len2) {
            ptr1 = fetch(buf1 + len1, s1, 0, len2, clut, nullptr);
            ptr2 = fetch(buf2 + len1, s2, 0, len2, clut, nullptr);
            for (int i = 0; i < len2; ++i) {
                uint t = ptr1[i];
                uint b = ptr2[i];
                buf1[i + len1] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
                buf2[i + len1] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            }
        }
        // Generate the rest by repeatedly repeating the previous set of pixels
        for (int i = image.width; i < count; ++i) {
            buf1[i] = buf1[i - image.width];
            buf2[i] = buf2[i - image.width];
        }
    } else {
        int start = qMax(x, image.x1);
        int end = qMin(x + count, image.x2);
        int len = qMax(1, end - start);
        int leading = start - x;

        ptr1 = fetch(buf1 + leading, s1, start, len, clut, nullptr);
        ptr2 = fetch(buf2 + leading, s2, start, len, clut, nullptr);

        for (int i = 0; i < len; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i + leading] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i + leading] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        for (int i = 0; i < leading; ++i) {
            buf1[i] = buf1[leading];
            buf2[i] = buf2[leading];
        }
        for (int i = leading + len; i < count; ++i) {
            buf1[i] = buf1[i - 1];
            buf2[i] = buf2[i - 1];
        }
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}